

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_method_get.c
# Opt level: O0

char * nhr_request_create_header_GET(nhr_request r,size_t *header_size)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  char *local_60;
  char *local_58;
  char *parameters;
  char *headers;
  char *buff;
  size_t parameters_len;
  size_t headers_len;
  size_t writed;
  size_t buff_size;
  size_t *header_size_local;
  nhr_request r_local;
  
  writed = 0;
  headers_len = 0;
  parameters_len = 0;
  buff = (char *)0x0;
  buff_size = (size_t)header_size;
  header_size_local = (size_t *)r;
  writed = strlen(r->path);
  sVar2 = strlen((char *)header_size_local[2]);
  writed = sVar2 + writed;
  if (header_size_local[0xb] == 0) {
    local_58 = (char *)0x0;
  }
  else {
    local_58 = nhr_request_http_headers((_nhr_map_node *)header_size_local[0xb],&parameters_len);
  }
  if (local_58 != (char *)0x0) {
    writed = parameters_len + writed;
  }
  if (header_size_local[0xc] == 0) {
    local_60 = (char *)0x0;
  }
  else {
    local_60 = nhr_request_url_encoded_parameters
                         ((_nhr_map_node *)header_size_local[0xc],(size_t *)&buff);
  }
  if (local_60 != (char *)0x0) {
    writed = (size_t)(buff + writed);
  }
  writed = writed + 0x100;
  __s = (char *)nhr_malloc(writed);
  if (local_60 == (char *)0x0) {
    iVar1 = sprintf(__s,"%s %s HTTP/%s\r\n","GET",header_size_local[3],k_nhr_request_http_ver);
  }
  else {
    iVar1 = sprintf(__s,"%s %s?%s HTTP/%s\r\n","GET",header_size_local[3],local_60,
                    k_nhr_request_http_ver);
  }
  headers_len = (size_t)iVar1;
  if ((short)*header_size_local == 0x50) {
    iVar1 = sprintf(__s + headers_len,"Host: %s\r\n",header_size_local[2]);
    headers_len = (long)iVar1 + headers_len;
  }
  else {
    iVar1 = sprintf(__s + headers_len,"Host: %s:%i\r\n",header_size_local[2],
                    (ulong)(ushort)*header_size_local);
    headers_len = (long)iVar1 + headers_len;
  }
  if (local_58 == (char *)0x0) {
    *(undefined2 *)(__s + headers_len) = *(undefined2 *)k_nhr_CRLF;
    headers_len = headers_len + 2;
  }
  else {
    iVar1 = sprintf(__s + headers_len,"%s\r\n\r\n",local_58);
    headers_len = (long)iVar1 + headers_len;
  }
  nhr_free(local_58);
  nhr_free(local_60);
  __s[headers_len] = '\0';
  *(size_t *)buff_size = headers_len;
  return __s;
}

Assistant:

char * nhr_request_create_header_GET(nhr_request r, size_t * header_size) {
    size_t buff_size = 0, writed = 0, headers_len = 0, parameters_len = 0;
    char * buff = NULL, *headers = NULL, *parameters = NULL;
    
    buff_size = strlen(r->path);
    buff_size += strlen(r->host);
    
    headers = r->http_headers ? nhr_request_http_headers(r->http_headers, &headers_len) : NULL;
    if (headers) buff_size += headers_len;
    
    parameters = r->parameters ? nhr_request_url_encoded_parameters(r->parameters, &parameters_len) : NULL;
    if (parameters) buff_size += parameters_len;
    
    buff_size += 1 << 8; // extra size for formatting strings
    buff = (char *)nhr_malloc(buff_size);
    
    if (parameters) {
        writed = nhr_sprintf(buff, buff_size, "%s %s?%s HTTP/%s\r\n", k_nhr_GET, r->path, parameters, k_nhr_request_http_ver);
    } else {
        writed = nhr_sprintf(buff, buff_size, "%s %s HTTP/%s\r\n", k_nhr_GET, r->path, k_nhr_request_http_ver);
    }
    
    if (r->port == 80) {
        writed += nhr_sprintf(buff + writed, buff_size - writed, "Host: %s\r\n", r->host);
    } else {
        writed += nhr_sprintf(buff + writed, buff_size - writed, "Host: %s:%i\r\n", r->host, (int)r->port);
    }
    
    if (headers) {
        writed += nhr_sprintf(buff + writed, buff_size - writed, "%s\r\n\r\n", headers);
    } else {
        memcpy(buff + writed, k_nhr_CRLF, k_nhr_CRLF_length);
        writed += k_nhr_CRLF_length;
    }
    
    nhr_free(headers);
    nhr_free(parameters);
    buff[writed] = 0;
    *header_size = writed;
    return buff;
}